

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLUri::initializeAuthority(XMLUri *this,XMLCh *uriSpec)

{
  short *psVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  XMLCh *toDelete_00;
  ulong uVar5;
  XMLCh *pXVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar7;
  MemoryManager *pMVar8;
  ulong uVar9;
  bool bVar10;
  ArrayJanitor<char16_t> portName;
  ArrayJanitor<char16_t> hostName;
  ArrayJanitor<char16_t> userName;
  ulong local_78;
  ulong local_70;
  ArrayJanitor<char16_t> local_60;
  ArrayJanitor<char16_t> local_50;
  ArrayJanitor<char16_t> local_40;
  XMLCh *toDelete;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  uVar9 = 0;
  if (uriSpec != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)uriSpec + uVar9);
      uVar9 = uVar9 + 2;
    } while (*psVar1 != 0);
    uVar9 = ((long)uVar9 >> 1) - 1;
  }
  lVar2 = uVar9 * 2 + 2;
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar2);
  toDelete = (XMLCh *)CONCAT44(extraout_var,iVar3);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
  iVar3 = XMLString::indexOf(uriSpec,L'@');
  if (iVar3 == -1) {
    toDelete = (XMLCh *)0x0;
    local_78 = 0;
  }
  else {
    XMLString::subString(toDelete,uriSpec,0,(long)iVar3,this->fMemoryManager);
    local_78 = (ulong)(iVar3 + 1);
  }
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar2);
  toDelete_00 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_50,toDelete_00,this->fMemoryManager);
  pXVar6 = uriSpec + local_78;
  if ((uVar9 < local_78 || uVar9 - local_78 == 0) || (uriSpec[local_78] != L'[')) {
    iVar3 = XMLString::indexOf(pXVar6,L':');
LAB_00252f87:
    if (iVar3 != -1) {
      XMLString::subString(toDelete_00,pXVar6,0,(long)iVar3,this->fMemoryManager);
      bVar10 = iVar3 != -2;
      local_70 = local_78 + (long)iVar3 + 1;
      goto LAB_00252ff0;
    }
  }
  else {
    iVar3 = XMLString::indexOf(pXVar6,L']');
    if (((iVar3 != -1) && (uVar5 = (long)iVar3 + local_78 + 1, uVar5 < uVar9)) &&
       (uriSpec[uVar5] == L':')) {
      iVar3 = iVar3 + 1;
      goto LAB_00252f87;
    }
  }
  bVar10 = false;
  XMLString::subString(toDelete_00,pXVar6,0,uVar9 - local_78,this->fMemoryManager);
  local_70 = uVar9;
LAB_00252ff0:
  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,lVar2);
  pXVar6 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_60,pXVar6,this->fMemoryManager);
  iVar3 = -1;
  if (((toDelete_00 != (XMLCh *)0x0) && ((bool)(*toDelete_00 != L'\0' & bVar10))) &&
     ((local_70 <= uVar9 && uVar9 - local_70 != 0 &&
      ((XMLString::subString(pXVar6,uriSpec + local_70,0,uVar9 - local_70,this->fMemoryManager),
       pXVar6 != (XMLCh *)0x0 && (*pXVar6 != L'\0')))))) {
    iVar3 = XMLString::parseInt(pXVar6,this->fMemoryManager);
  }
  bVar10 = isValidServerBasedAuthority(toDelete_00,iVar3,toDelete,this->fMemoryManager);
  if (bVar10) {
    if (this->fHost != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    if (this->fUserInfo != (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
    }
    pMVar8 = this->fMemoryManager;
    if (toDelete_00 == (XMLCh *)0x0) {
      pXVar6 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)toDelete_00 + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*pMVar8->_vptr_MemoryManager[3])(pMVar8,sVar7);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
      memcpy(pXVar6,toDelete_00,sVar7);
      pMVar8 = this->fMemoryManager;
    }
    this->fHost = pXVar6;
    this->fPort = iVar3;
    if (toDelete == (XMLCh *)0x0) {
      pXVar6 = (XMLCh *)0x0;
    }
    else {
      sVar7 = 0;
      do {
        psVar1 = (short *)((long)toDelete + sVar7);
        sVar7 = sVar7 + 2;
      } while (*psVar1 != 0);
      iVar3 = (*pMVar8->_vptr_MemoryManager[3])(pMVar8,sVar7);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
      memcpy(pXVar6,toDelete,sVar7);
    }
    this->fUserInfo = pXVar6;
  }
  else {
    setRegBasedAuthority(this,uriSpec);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_60);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_50);
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void XMLUri::initializeAuthority(const XMLCh* const uriSpec)
{

    int index = 0;
    XMLSize_t start = 0;
    const XMLSize_t end = XMLString::stringLen(uriSpec);

    //
    // server = [ [ userinfo "@" ] hostport ]
    // userinfo is everything up @,
    //
    XMLCh* userinfo = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> userName(userinfo, fMemoryManager);
    index = XMLString::indexOf(&(uriSpec[start]), chAt);

    if ( index != -1)
    {
        XMLString::subString(userinfo, &(uriSpec[start]), 0, index, fMemoryManager);
        index++; // skip the @
        start += index;
    }
    else
    {
        userinfo = 0;
    }

    //
    // hostport = host [ ":" port ]
    // host is everything up to ':', or up to
    // and including ']' if followed by ':'.
    //
    XMLCh* host = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> hostName(host, fMemoryManager);

    // Search for port boundary.
    if (start < end && uriSpec[start] == chOpenSquare)
    {
    	index = XMLString::indexOf(&(uriSpec[start]), chCloseSquare);
    	if (index != -1)
    	{
            // skip the ']'
            index = ((start + index + 1) < end
              && uriSpec[start + index + 1] == chColon) ? index+1 : -1;
    	}
    }
    else
    {
        index = XMLString::indexOf(&(uriSpec[start]), chColon);
    }

    if ( index != -1 )
    {
        XMLString::subString(host, &(uriSpec[start]), 0, index, fMemoryManager);
        index++;  // skip the :
        start +=index;
    }
    else
    {
        XMLString::subString(host, &(uriSpec[start]), 0, end-start, fMemoryManager);
        start = end;
    }

    // port is everything after ":"

    XMLCh* portStr = (XMLCh*) fMemoryManager->allocate
    (
        (end+1) * sizeof(XMLCh)
    );//new XMLCh[end+1];
    ArrayJanitor<XMLCh> portName(portStr, fMemoryManager);
    int port = -1;

    if ((host && *host) &&   // non empty host
        (index != -1)                    &&   // ":" found
        (start < end)                     )   // ":" is not the last
    {
        XMLString::subString(portStr, &(uriSpec[start]), 0, end-start, fMemoryManager);

        if (portStr && *portStr)
        {
            port = XMLString::parseInt(portStr, fMemoryManager);
        }
    } // if > 0

    // Check if we have server based authority.
    if (isValidServerBasedAuthority(host, port, userinfo, fMemoryManager))
    {
        if (fHost)
            fMemoryManager->deallocate(fHost);//delete [] fHost;

        if (fUserInfo)
            fMemoryManager->deallocate(fUserInfo);//delete[] fUserInfo;

        fHost = XMLString::replicate(host, fMemoryManager);
        fPort = port;
        fUserInfo = XMLString::replicate(userinfo, fMemoryManager);

        return;
    }
    // This must be registry based authority or the URI is malformed.
    setRegBasedAuthority(uriSpec);
}